

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_7f91c2::ComputePresetInheritance<cmCMakePresetsGraph::WorkflowPreset>
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
           *presets,cmCMakePresetsGraph *graph)

{
  bool bVar1;
  reference __k;
  mapped_type *pmVar2;
  PresetPair<cmCMakePresetsGraph::WorkflowPreset> *preset_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  local_e0;
  ReadFileResult local_ac;
  PresetPair<cmCMakePresetsGraph::WorkflowPreset> *pPStack_a8;
  ReadFileResult result;
  WorkflowPreset *preset;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
  *it_1;
  iterator __end0_1;
  iterator __begin0_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
  *it;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  cycleStatus;
  cmCMakePresetsGraph *graph_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  *presets_local;
  
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)graph;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
         *)&__range2);
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
           ::begin(presets);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
          ::end(presets);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&it), bVar1) {
    __k = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
          ::operator*(&__end0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                           *)&__range2,&__k->first);
    *pmVar2 = Unvisited;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
    ::operator++(&__end0);
  }
  __end0_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
             ::begin(presets);
  it_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
            ::end(presets);
  while (bVar1 = std::operator!=(&__end0_1,(_Self *)&it_1), bVar1) {
    preset = (WorkflowPreset *)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
             ::operator*(&__end0_1);
    preset_00 = &((reference)preset)->second;
    pPStack_a8 = preset_00;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::map(&local_e0,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           *)&__range2);
    presets_local._4_4_ =
         VisitPreset<cmCMakePresetsGraph::WorkflowPreset>
                   (&preset_00->Unexpanded,presets,&local_e0,
                    (cmCMakePresetsGraph *)
                    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map(&local_e0);
    local_ac = presets_local._4_4_;
    if (presets_local._4_4_ != READ_OK) goto LAB_0042c5cb;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
    ::operator++(&__end0_1);
  }
  presets_local._4_4_ = READ_OK;
LAB_0042c5cb:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          *)&__range2);
  return presets_local._4_4_;
}

Assistant:

ReadFileResult ComputePresetInheritance(
  std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  const cmCMakePresetsGraph& graph)
{
  std::map<std::string, CycleStatus> cycleStatus;
  for (auto const& it : presets) {
    cycleStatus[it.first] = CycleStatus::Unvisited;
  }

  for (auto& it : presets) {
    auto& preset = it.second.Unexpanded;
    auto result = VisitPreset<T>(preset, presets, cycleStatus, graph);
    if (result != ReadFileResult::READ_OK) {
      return result;
    }
  }

  return ReadFileResult::READ_OK;
}